

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCore.c
# Opt level: O3

int Xyz_ManPerform(Aig_Man_t *pAig,Xyz_ParTry_t *pPar)

{
  return 1;
}

Assistant:

int Xyz_ManPerform( Aig_Man_t * pAig, Xyz_ParTry_t * pPar )
{
    Xyz_ManTry_t * p;
    int RetValue;
    p = Xyz_ManTryAlloc( pAig, pPar );
    RetValue = 1;
    Xyz_ManTryFree( p );
    return RetValue;
}